

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hpp
# Opt level: O2

void __thiscall
nestl::test::allocator_with_state<int>::~allocator_with_state(allocator_with_state<int> *this)

{
  bool bVar1;
  element_type *peVar2;
  
  bVar1 = impl::shared_ptr::operator_cast_to_bool((shared_ptr *)this);
  if (bVar1) {
    peVar2 = impl::
             shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
             operator->(&this->m_allocated_storage);
    if ((peVar2->m_impl).m_impl.m_node_count != 0) {
      fatal_failure<char_const(&)[25]>((char (*) [25])"memory leaks detected!!!");
    }
  }
  impl::shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
  ~shared_ptr(&this->m_allocated_storage);
  return;
}

Assistant:

~allocator_with_state() NESTL_NOEXCEPT_SPEC
    {
        if (m_allocated_storage && !m_allocated_storage->empty())
        {
            fatal_failure("memory leaks detected!!!");
        }
    }